

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  ImVec2 IVar2;
  ushort uVar3;
  uint *puVar4;
  uchar *puVar5;
  uint *puVar6;
  ImFont *pIVar7;
  ImFontAtlasCustomRect *pIVar8;
  int iVar9;
  long lVar10;
  int i;
  long lVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int i_1;
  uint uVar19;
  float fVar21;
  ImVec2 local_40;
  ImVec2 local_38;
  ulong uVar20;
  
  iVar12 = atlas->PackIdMouseCursors;
  pIVar8 = (atlas->CustomRects).Data;
  uVar3 = pIVar8[iVar12].X;
  if ((atlas->Flags & 2) == 0) {
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar8[iVar12].Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar3 + 0x7b,(uint)pIVar8[iVar12].Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar8[iVar12].Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar3 + 0x7b,(uint)pIVar8[iVar12].Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    iVar13 = atlas->TexWidth;
    lVar11 = (ulong)pIVar8[iVar12].Y * (long)iVar13 + (ulong)uVar3;
    iVar9 = (int)lVar11;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar4 = atlas->TexPixelsRGBA32;
      puVar6 = puVar4 + (iVar13 + iVar9);
      puVar6[0] = 0xffffffff;
      puVar6[1] = 0xffffffff;
      puVar4 = puVar4 + iVar9;
      puVar4[0] = 0xffffffff;
      puVar4[1] = 0xffffffff;
    }
    else {
      lVar10 = (long)iVar9 + (long)iVar13;
      atlas->TexPixelsAlpha8[lVar10 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar10] = 0xff;
      atlas->TexPixelsAlpha8[lVar11 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar11] = 0xff;
    }
  }
  uVar14._0_2_ = pIVar8[iVar12].X;
  uVar14._2_2_ = pIVar8[iVar12].Y;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(uVar14 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar2.y * ((float)(uVar14 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar8 = (atlas->CustomRects).Data + atlas->PackIdLines;
    lVar10 = 0;
    iVar12 = 0;
    lVar11 = 0;
    while (lVar11 != 0x40) {
      uVar14 = (uint)pIVar8->Width;
      puVar5 = atlas->TexPixelsAlpha8;
      iVar13 = (int)lVar11;
      if (puVar5 == (uchar *)0x0) {
        puVar6 = atlas->TexPixelsRGBA32;
        uVar15 = (uint)pIVar8->X;
        uVar3 = pIVar8->Y;
        uVar20 = (ulong)((iVar13 + (uint)uVar3) * atlas->TexWidth + uVar15);
        uVar19 = iVar12 + uVar14 >> 1;
        uVar16 = (ulong)uVar19;
        for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
          puVar6[uVar20 + uVar17] = 0;
        }
        for (lVar18 = 0; lVar11 != lVar18; lVar18 = lVar18 + 1) {
          puVar6[uVar16 + uVar20 + lVar18] = 0xffffffff;
        }
        for (uVar17 = 0; (iVar12 + uVar14) - uVar19 != uVar17; uVar17 = uVar17 + 1) {
          *(undefined4 *)((long)puVar6 + uVar17 * 4 + lVar10 + uVar16 * 4 + uVar20 * 4) = 0;
        }
      }
      else {
        uVar16 = (ulong)(((uint)pIVar8->Y + iVar13) * atlas->TexWidth + (uint)pIVar8->X);
        uVar19 = iVar12 + uVar14 >> 1;
        uVar20 = (ulong)uVar19;
        for (uVar17 = 0; uVar20 != uVar17; uVar17 = uVar17 + 1) {
          puVar5[uVar17 + uVar16] = '\0';
        }
        for (lVar18 = 0; lVar11 != lVar18; lVar18 = lVar18 + 1) {
          puVar5[lVar18 + uVar16 + uVar20] = 0xff;
        }
        for (uVar17 = 0; (iVar12 + uVar14) - uVar19 != uVar17; uVar17 = uVar17 + 1) {
          puVar5[uVar17 + uVar16 + uVar20 + lVar11] = '\0';
        }
        uVar15 = (uint)pIVar8->X;
        uVar3 = pIVar8->Y;
      }
      uVar14 = uVar14 - iVar13 >> 1;
      fVar1 = (atlas->TexUvScale).x;
      fVar21 = (atlas->TexUvScale).y;
      atlas->TexUvLines[lVar11].x = (float)((uVar15 + uVar14) - 1) * fVar1;
      fVar21 = ((float)(int)((uint)uVar3 + iVar13 + 1) * fVar21 +
               (float)(int)((uint)uVar3 + iVar13) * fVar21) * 0.5;
      atlas->TexUvLines[lVar11].y = fVar21;
      atlas->TexUvLines[lVar11].z = fVar1 * (float)(uVar15 + uVar14 + (int)(lVar11 + 1));
      atlas->TexUvLines[lVar11].w = fVar21;
      iVar12 = iVar12 + -1;
      lVar10 = lVar10 + 4;
      lVar11 = lVar11 + 1;
    }
  }
  lVar10 = 0;
  for (lVar11 = 0; lVar11 < (atlas->CustomRects).Size; lVar11 = lVar11 + 1) {
    pIVar8 = (atlas->CustomRects).Data;
    pIVar7 = *(ImFont **)((long)&pIVar8->Font + lVar10);
    if ((pIVar7 != (ImFont *)0x0) &&
       (iVar12 = *(int *)((long)&pIVar8->GlyphID + lVar10), iVar12 != 0)) {
      local_38.x = 0.0;
      local_38.y = 0.0;
      local_40.x = 0.0;
      local_40.y = 0.0;
      ImFontAtlas::CalcCustomRectUV
                (atlas,(ImFontAtlasCustomRect *)((long)&pIVar8->Width + lVar10),&local_38,&local_40)
      ;
      fVar1 = *(float *)((long)&(pIVar8->GlyphOffset).x + lVar10);
      fVar21 = *(float *)((long)&(pIVar8->GlyphOffset).y + lVar10);
      ImFont::AddGlyph(pIVar7,(ImFontConfig *)0x0,(ImWchar)iVar12,fVar1,fVar21,
                       (float)*(ushort *)((long)&pIVar8->Width + lVar10) + fVar1,
                       (float)*(ushort *)((long)&pIVar8->Height + lVar10) + fVar21,local_38.x,
                       local_38.y,local_40.x,local_40.y,
                       *(float *)((long)&pIVar8->GlyphAdvanceX + lVar10));
    }
    lVar10 = lVar10 + 0x20;
  }
  for (lVar11 = 0; lVar11 < (atlas->Fonts).Size; lVar11 = lVar11 + 1) {
    pIVar7 = (atlas->Fonts).Data[lVar11];
    if (pIVar7->DirtyLookupTables == true) {
      ImFont::BuildLookupTable(pIVar7);
    }
  }
  atlas->TexReady = true;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    atlas->TexReady = true;
}